

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  char cVar3;
  char cVar4;
  char *pcVar5;
  ostream *poVar6;
  string *this_00;
  bool bVar7;
  ostringstream os;
  allocator local_289;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  string local_248;
  string local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [40];
  long local_1a0 [3];
  uint auStack_188 [88];
  
  pcVar5 = *(char **)this;
  cVar3 = *pcVar5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  puVar2 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
  *puVar2 = *puVar2 | 1;
  poVar6 = std::operator<<((ostream *)local_1a0,"[optional:");
  cVar4 = *pcVar5;
  if (cVar4 == '\x01') {
    to_string<(anonymous_namespace)::Explicit>(&local_248,(Explicit *)(pcVar5 + 4));
    local_288 = &local_278;
    local_280 = local_248._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == &local_248.field_2) {
      local_278._8_8_ = local_248.field_2._8_8_;
    }
    else {
      local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_228,"[empty]",&local_289);
    local_280 = local_228._M_string_length;
    paVar1 = &local_228.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == paVar1) {
      local_248.field_2._8_8_ = local_228.field_2._8_8_;
      local_228._M_dataplus._M_p = (pointer)&local_248.field_2;
    }
    local_248.field_2._M_allocated_capacity =
         (ulong)(uint7)local_228.field_2._M_allocated_capacity._1_7_ << 8;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    bVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p == &local_248.field_2;
    local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p;
    local_228._M_dataplus._M_p = (pointer)paVar1;
    if (bVar7) {
      local_278._8_8_ = local_248.field_2._8_8_;
      local_288 = &local_278;
    }
  }
  local_278._M_allocated_capacity = local_248.field_2._M_allocated_capacity;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_allocated_capacity =
       local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
  poVar6 = std::operator<<(poVar6,(string *)&local_288);
  std::operator<<(poVar6,"]");
  std::__cxx11::string::~string((string *)&local_288);
  this_00 = &local_248;
  if (cVar4 == '\0') {
    std::__cxx11::string::~string((string *)this_00);
    this_00 = &local_228;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::ostringstream::str();
  if (local_288 == &local_278) {
    local_1f8._8_8_ = local_278._8_8_;
    local_208 = &local_1f8;
  }
  else {
    local_208 = local_288;
  }
  local_1f8._M_allocated_capacity = local_278._M_allocated_capacity;
  local_200 = local_280;
  local_280 = 0;
  local_278._M_allocated_capacity = local_278._M_allocated_capacity & 0xffffffffffffff00;
  local_288 = &local_278;
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  if (local_208 == &local_1f8) {
    local_258._8_8_ = local_1f8._8_8_;
    local_268 = &local_258;
  }
  else {
    local_268 = local_208;
  }
  local_258._M_allocated_capacity = local_1f8._M_allocated_capacity;
  local_260 = local_200;
  local_200 = 0;
  local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00;
  local_208 = &local_1f8;
  std::__cxx11::string::~string((string *)&local_208);
  local_1e0 = local_260;
  local_1e8 = &local_1d8;
  if (local_268 == &local_258) {
    local_1d8._8_8_ = local_258._8_8_;
  }
  else {
    local_1e8 = local_268;
  }
  local_260 = 0;
  local_258._M_allocated_capacity = local_258._M_allocated_capacity & 0xffffffffffffff00;
  local_268 = &local_258;
  local_1c8[0] = cVar3;
  std::__cxx11::string::string((string *)(local_1c8 + 8),(string *)&local_1e8);
  result::result(__return_storage_ptr__,(result *)local_1c8);
  std::__cxx11::string::~string((string *)(local_1c8 + 8));
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_268);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }